

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::MatchCharNode::Emit(MatchCharNode *this,Compiler *compiler,CharCount *skipped)

{
  uint *puVar1;
  uint local_24;
  CharCount *local_20;
  CharCount *skipped_local;
  Compiler *compiler_local;
  MatchCharNode *this_local;
  
  if (*skipped == 0) {
    local_24 = 1;
    local_20 = skipped;
    skipped_local = (CharCount *)compiler;
    compiler_local = (Compiler *)this;
    puVar1 = min<unsigned_int>(skipped,&local_24);
    *local_20 = *local_20 - *puVar1;
    Emit((Compiler *)skipped_local,this->cs,(bool)(this->isEquivClass & 1));
  }
  else {
    *skipped = *skipped - 1;
  }
  return;
}

Assistant:

void MatchCharNode::Emit(Compiler& compiler, CharCount& skipped)
    {
        if (skipped >= 1)
        {
            // Asking to skip entire char
            skipped--;
            return;
        }

        //
        // Compilation scheme:
        //
        //   MatchChar(2|3|4)?
        //

        skipped -= min(skipped, static_cast<CharCount>(1));

        Emit(compiler, cs, isEquivClass);
    }